

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O0

void __thiscall iqxmlrpc::BuilderBase::do_visit_text(BuilderBase *this,string *param_1)

{
  XML_RPC_violation *this_00;
  string local_38;
  string *local_18;
  string *param_1_local;
  BuilderBase *this_local;
  
  if ((this->expect_text_ & 1U) != 0) {
    local_18 = param_1;
    param_1_local = (string *)this;
    this_00 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
    Parser::context_abi_cxx11_(&local_38,this->parser_);
    XML_RPC_violation::XML_RPC_violation(this_00,&local_38);
    __cxa_throw(this_00,&XML_RPC_violation::typeinfo,XML_RPC_violation::~XML_RPC_violation);
  }
  return;
}

Assistant:

void
BuilderBase::do_visit_text(const std::string&)
{
  if (expect_text_) {
    // proper handler was not implemented
    throw XML_RPC_violation(parser_.context());
  }
}